

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O3

QSize __thiscall QLabel::minimumSizeHint(QLabel *this)

{
  uint uVar1;
  QLabelPrivate *this_00;
  QSizePolicy QVar2;
  QSize QVar3;
  QSize QVar4;
  ulong uVar5;
  
  this_00 = *(QLabelPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  if (((this_00->field_0x340 & 1) != 0) &&
     (QVar2 = QWidget::sizePolicy((QWidget *)this),
     (anon_union_4_2_313b0b05_for_QSizePolicy_1)(this_00->sizePolicy).field_0.data ==
     QVar2.field_0.data)) {
    return this_00->msh;
  }
  QWidget::ensurePolished((QWidget *)this);
  this_00->field_0x340 = this_00->field_0x340 | 1;
  QVar3 = QLabelPrivate::sizeForWidth(this_00,-1);
  this_00->sh = QVar3;
  if ((this_00->field_0x340 & 0x10) == 0) {
    uVar5 = (ulong)QVar3 >> 0x20;
  }
  else {
    QVar4 = QLabelPrivate::sizeForWidth(this_00,0xffffff);
    uVar5 = (ulong)QVar4 >> 0x20;
    QVar3 = QLabelPrivate::sizeForWidth(this_00,0);
    uVar1 = (this_00->sh).ht.m_i;
    if ((int)uVar1 < QVar4.ht.m_i.m_i) {
      uVar5 = (ulong)uVar1;
    }
  }
  QVar3 = (QSize)((ulong)QVar3 & 0xffffffff | uVar5 << 0x20);
  this_00->msh = QVar3;
  QVar2 = QWidget::sizePolicy((QWidget *)this);
  (this_00->sizePolicy).field_0.bits = (Bits)QVar2.field_0;
  return QVar3;
}

Assistant:

QSize QLabel::minimumSizeHint() const
{
    Q_D(const QLabel);
    if (d->valid_hints) {
        if (d->sizePolicy == sizePolicy())
            return d->msh;
    }

    ensurePolished();
    d->valid_hints = true;
    d->sh = d->sizeForWidth(-1); // wrap ? golden ratio : min doc size
    QSize msh(-1, -1);

    if (!d->isTextLabel) {
        msh = d->sh;
    } else {
        msh.rheight() = d->sizeForWidth(QWIDGETSIZE_MAX).height(); // height for one line
        msh.rwidth() = d->sizeForWidth(0).width(); // wrap ? size of biggest word : min doc size
        if (d->sh.height() < msh.height())
            msh.rheight() = d->sh.height();
    }
    d->msh = msh;
    d->sizePolicy = sizePolicy();
    return msh;
}